

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall
QIconModeViewBase::setPositionForIndex(QIconModeViewBase *this,QPoint *position,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QModelIndex *index_00;
  qsizetype qVar4;
  QModelIndex *in_RDX;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QPoint *unaff_retaddr;
  int in_stack_0000000c;
  QSize oldContents;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QModelIndex::row(in_RDX);
  index_00 = (QModelIndex *)(long)iVar3;
  qVar4 = QList<QListViewItem>::size((QList<QListViewItem> *)(in_RDI + 0xc));
  if ((long)index_00 < qVar4) {
    QAbstractItemView::update((QAbstractItemView *)in_RDX,index_00);
    QModelIndex::row(in_RDX);
    moveItem((QIconModeViewBase *)index,in_stack_0000000c,unaff_retaddr);
    QAbstractItemView::update((QAbstractItemView *)in_RDX,index_00);
    bVar2 = ::operator!=((QSize *)index_00,in_RDI);
    if (bVar2) {
      QListViewPrivate::viewUpdateGeometries((QListViewPrivate *)0x8847e3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconModeViewBase::setPositionForIndex(const QPoint &position, const QModelIndex &index)
{
    if (index.row() >= items.size())
        return;
    const QSize oldContents = contentsSize;
    qq->update(index); // update old position
    moveItem(index.row(), position);
    qq->update(index); // update new position

    if (contentsSize != oldContents)
        dd->viewUpdateGeometries(); // update the scroll bars
}